

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdct.c
# Opt level: O2

void mdct_butterfly_8(ogg_int32_t *x)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  
  iVar1 = *x + x[4];
  iVar5 = x[4] - *x;
  iVar2 = x[1] + x[5];
  iVar6 = x[5] - x[1];
  iVar3 = x[2] + x[6];
  iVar7 = x[6] - x[2];
  iVar4 = x[3] + x[7];
  iVar8 = x[7] - x[3];
  *x = iVar7 + iVar6;
  x[1] = iVar8 - iVar5;
  x[2] = iVar7 - iVar6;
  x[3] = iVar8 + iVar5;
  x[4] = iVar3 - iVar1;
  x[5] = iVar4 - iVar2;
  x[6] = iVar3 + iVar1;
  x[7] = iVar4 + iVar2;
  return;
}

Assistant:

STIN void mdct_butterfly_8(DATA_TYPE *x){

  REG_TYPE r0   = x[4] + x[0];
  REG_TYPE r1   = x[4] - x[0];
  REG_TYPE r2   = x[5] + x[1];
  REG_TYPE r3   = x[5] - x[1];
  REG_TYPE r4   = x[6] + x[2];
  REG_TYPE r5   = x[6] - x[2];
  REG_TYPE r6   = x[7] + x[3];
  REG_TYPE r7   = x[7] - x[3];

	   x[0] = r5   + r3;
	   x[1] = r7   - r1;
	   x[2] = r5   - r3;
	   x[3] = r7   + r1;
           x[4] = r4   - r0;
	   x[5] = r6   - r2;
           x[6] = r4   + r0;
	   x[7] = r6   + r2;
	   MB();
}